

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

int Gem_GroupsDerive(word *pTruth,int nVars,word *pCof0,word *pCof1)

{
  word *pwVar1;
  word *pwVar2;
  uint iVar;
  ulong uVar3;
  uint nWords_00;
  uint uVar4;
  uint iVar_00;
  ulong uVar5;
  uint local_4c;
  int nWords;
  
  uVar4 = nVars - 1;
  local_4c = 1 << ((byte)uVar4 & 0x1f);
  nWords_00 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords_00 = 1;
  }
  uVar5 = 0;
  if (0 < (int)nWords_00) {
    uVar5 = (ulong)nWords_00;
  }
  iVar = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
LAB_003cd251:
  do {
    iVar_00 = iVar;
    if (iVar_00 == uVar4) {
      return local_4c;
    }
    iVar = iVar_00 + 1;
    Abc_TtCofactor0p(pCof0,pTruth,nWords_00,iVar_00);
    Abc_TtCofactor1p(pCof1,pTruth,nWords_00,iVar_00);
    Abc_TtCofactor1(pCof0,nWords_00,iVar);
    Abc_TtCofactor0(pCof1,nWords_00,iVar);
    uVar3 = 0;
    do {
      if (uVar5 == uVar3) goto LAB_003cd251;
      pwVar1 = pCof0 + uVar3;
      pwVar2 = pCof1 + uVar3;
      uVar3 = uVar3 + 1;
    } while (*pwVar1 == *pwVar2);
    local_4c = local_4c | 1 << (iVar_00 & 0x1f);
  } while( true );
}

Assistant:

int Gem_GroupsDerive( word * pTruth, int nVars, word * pCof0, word * pCof1 )
{
    int v, Res = 1 << (nVars-1);
    for ( v = 0; v < nVars-1; v++ )
        if ( !Abc_TtVarsAreSymmetric(pTruth, nVars, v, v+1, pCof0, pCof1) )
            Res |= (1 << v);
    return Res;
}